

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O3

bool Inferences::Superposition::checkSuperpositionFromVariable
               (Clause *eqClause,Literal *eqLit,TermList eqLHS)

{
  Term *this;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  TermList arg;
  TermList local_38;
  
  if ((*(ulong *)&eqClause->field_0x38 & 0xfffff) == 0) {
    bVar6 = true;
  }
  else {
    uVar4 = (ulong)((uint)*(ulong *)&eqClause->field_0x38 & 0xfffff);
    uVar3 = 0;
    bVar6 = false;
    do {
      this = &eqClause->_literals[uVar3]->super_Term;
      if (this != &eqLit->super_Term) {
        if (this->_functor == 0) {
          iVar2 = 0;
          bVar1 = true;
          do {
            bVar5 = bVar1;
            local_38._content =
                 this->_args[(long)iVar2 + (ulong)(*(uint *)&this->field_0xc & 0xfffffff)]._content;
            if (((local_38._content & 3) == 0) &&
               (bVar1 = Kernel::TermList::containsSubterm(&local_38,eqLHS), bVar1)) {
              return bVar6;
            }
            iVar2 = -1;
            bVar1 = false;
          } while (bVar5);
        }
        else {
          bVar1 = Kernel::Term::containsSubterm(this,eqLHS);
          if (bVar1) {
            return bVar6;
          }
        }
      }
      uVar3 = uVar3 + 1;
      bVar6 = uVar4 <= uVar3;
    } while (uVar3 != uVar4);
  }
  return bVar6;
}

Assistant:

bool Superposition::checkSuperpositionFromVariable(Clause* eqClause, Literal* eqLit, TermList eqLHS)
{
  ASS(eqLHS.isVar());
  //if we should do rewriting, LHS cannot appear inside RHS
  //ASS_REP(!EqHelper::getOtherEqualitySide(eqLit, eqLHS).containsSubterm(eqLHS), eqLit->toString());

  unsigned clen = eqClause->length();
  for(unsigned i=0; i<clen; i++) {
    Literal* lit = (*eqClause)[i];
    if(lit==eqLit) {
      continue;
    }
    if(lit->isEquality()) {
      for(unsigned aIdx=0; aIdx<2; aIdx++) {
	TermList arg = *lit->nthArgument(aIdx);
	if(arg.isTerm() && arg.containsSubterm(eqLHS)) {
	  return false;
	}
      }
    }
    else if(lit->containsSubterm(eqLHS)) {
      return false;
    }
  }

  return true;
}